

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O1

uint32_t helper_atomic_cmpxchgw_be_mmu_tricore
                   (CPUArchState_conflict30 *env,target_ulong_conflict addr,uint32_t cmpv,
                   uint32_t newv,TCGMemOpIdx oi,uintptr_t retaddr)

{
  ushort uVar1;
  ushort *puVar2;
  ushort uVar3;
  
  puVar2 = (ushort *)atomic_mmu_lookup(env,addr,oi,retaddr);
  uVar3 = (ushort)cmpv << 8 | (ushort)cmpv >> 8;
  LOCK();
  uVar1 = *puVar2;
  if (uVar3 == uVar1) {
    *puVar2 = (ushort)newv << 8 | (ushort)newv >> 8;
    uVar1 = uVar3;
  }
  UNLOCK();
  return (uint32_t)(ushort)(uVar1 << 8 | uVar1 >> 8);
}

Assistant:

ABI_TYPE ATOMIC_NAME(cmpxchg)(CPUArchState *env, target_ulong addr,
                              ABI_TYPE cmpv, ABI_TYPE newv EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    DATA_TYPE ret;
#if DATA_SIZE == 16
    ret = atomic16_cmpxchg(haddr, BSWAP(cmpv), BSWAP(newv));
#else
#ifdef _MSC_VER
    ret = atomic_cmpxchg__nocheck((long *)haddr, BSWAP(cmpv), BSWAP(newv));
#else
    ret = atomic_cmpxchg__nocheck(haddr, BSWAP(cmpv), BSWAP(newv));
#endif
#endif
    ATOMIC_MMU_CLEANUP;
    return BSWAP(ret);
}